

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O3

void __thiscall CLI::App::_validate(App *this)

{
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *puVar1;
  pointer psVar2;
  pointer pcVar3;
  bool bVar4;
  InvalidError *pIVar5;
  __normal_iterator<const_std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var6;
  ulong uVar7;
  long lVar8;
  App_p *app;
  pointer psVar9;
  _Iter_pred<CLI::App::_validate()const::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
  local_91;
  string local_90;
  string local_70;
  string local_50;
  
  _Var6._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var6._M_current != puVar1) {
    uVar7 = 0;
    do {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<CLI::App::_validate()const::{lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)#1}>
              ::operator()(&local_91,_Var6);
      uVar7 = uVar7 + bVar4;
      _Var6._M_current = _Var6._M_current + 1;
    } while (_Var6._M_current != puVar1);
    if (1 < uVar7) {
      _Var6._M_current =
           (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (this->options_).
               super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar8 = 0;
      if (_Var6._M_current != puVar1) {
        do {
          bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<CLI::App::_validate()const::{lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)#2}>
                  ::operator()((_Iter_pred<CLI::App::_validate()const::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_2_>
                                *)&local_91,_Var6);
          lVar8 = lVar8 + (ulong)bVar4;
          _Var6._M_current = _Var6._M_current + 1;
        } while (_Var6._M_current != puVar1);
      }
      if (1 < (long)(uVar7 - lVar8)) {
        pIVar5 = (InvalidError *)__cxa_allocate_exception(0x38);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar3 = (this->name_)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar3,pcVar3 + (this->name_)._M_string_length);
        InvalidError::InvalidError(pIVar5,&local_50);
        __cxa_throw(pIVar5,&InvalidError::typeinfo,Error::~Error);
      }
    }
  }
  psVar2 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = 0;
  for (psVar9 = (this->subcommands_).
                super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar9 != psVar2; psVar9 = psVar9 + 1) {
    _validate((psVar9->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    lVar8 = lVar8 + (ulong)((((psVar9->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->name_)._M_string_length == 0);
  }
  uVar7 = this->require_option_min_;
  if (uVar7 != 0) {
    if (this->require_option_max_ < uVar7 && this->require_option_max_ != 0) {
      pIVar5 = (InvalidError *)__cxa_allocate_exception(0x38);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Required min options greater than required max options","");
      InvalidError::InvalidError(pIVar5,&local_70,InvalidError);
      __cxa_throw(pIVar5,&InvalidError::typeinfo,Error::~Error);
    }
    if ((ulong)(((long)(this->options_).
                       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->options_).
                       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) + lVar8) < uVar7) {
      pIVar5 = (InvalidError *)__cxa_allocate_exception(0x38);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"Required min options greater than number of available options"
                 ,"");
      InvalidError::InvalidError(pIVar5,&local_90,InvalidError);
      __cxa_throw(pIVar5,&InvalidError::typeinfo,Error::~Error);
    }
  }
  return;
}

Assistant:

CLI11_INLINE void App::_validate() const {
    // count the number of positional only args
    auto pcount = std::count_if(std::begin(options_), std::end(options_), [](const Option_p &opt) {
        return opt->get_items_expected_max() >= detail::expected_max_vector_size && !opt->nonpositional();
    });
    if(pcount > 1) {
        auto pcount_req = std::count_if(std::begin(options_), std::end(options_), [](const Option_p &opt) {
            return opt->get_items_expected_max() >= detail::expected_max_vector_size && !opt->nonpositional() &&
                   opt->get_required();
        });
        if(pcount - pcount_req > 1) {
            throw InvalidError(name_);
        }
    }

    std::size_t nameless_subs{0};
    for(const App_p &app : subcommands_) {
        app->_validate();
        if(app->get_name().empty())
            ++nameless_subs;
    }

    if(require_option_min_ > 0) {
        if(require_option_max_ > 0) {
            if(require_option_max_ < require_option_min_) {
                throw(InvalidError("Required min options greater than required max options", ExitCodes::InvalidError));
            }
        }
        if(require_option_min_ > (options_.size() + nameless_subs)) {
            throw(
                InvalidError("Required min options greater than number of available options", ExitCodes::InvalidError));
        }
    }
}